

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

CPAccessResult access_lorid(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  
  if (((env->features & 0x200000000) != 0) && (((env->cp15).scr_el3 & 1) == 0)) {
    return CP_ACCESS_OK;
  }
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 != 0x10) {
        if (uVar2 == 0x16) {
          return CP_ACCESS_OK;
        }
        if (uVar2 == 0x1a) goto LAB_0061d451;
        if ((uVar1 >> 0x21 & 1) != 0) {
          if (uVar2 == 0x16) {
            if (((uint)uVar1 >> 0x1c & 1) == 0) {
              return CP_ACCESS_OK;
            }
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
            return CP_ACCESS_OK;
          }
        }
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
      if (1 < uVar2) {
        if (uVar2 != 2) {
          return CP_ACCESS_OK;
        }
        goto LAB_0061d451;
      }
    }
  }
  uVar3 = arm_hcr_el2_eff_aarch64(env);
  if ((uVar3 >> 0x23 & 1) != 0) {
    return CP_ACCESS_TRAP_EL2;
  }
LAB_0061d451:
  if (((env->cp15).scr_el3 & 0x4000) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static inline bool arm_is_secure_below_el3(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        return !(env->cp15.scr_el3 & SCR_NS);
    } else {
        /* If EL3 is not supported then the secure state is implementation
         * defined, in which case QEMU defaults to non-secure.
         */
        return false;
    }
}